

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O3

spv_result_t spvtools::val::IdPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  uint uVar2;
  ValidationState_t *pVVar3;
  bool bVar4;
  int32_t iVar5;
  spv_result_t sVar6;
  pointer psVar7;
  Instruction *pIVar8;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint uVar13;
  Op op;
  function<bool_(unsigned_int)> can_have_forward_declared_ids;
  string local_260;
  uint32_t local_23c;
  ValidationState_t *local_238;
  ulong local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  DiagnosticStream local_208;
  undefined8 uVar9;
  
  bVar4 = spvIsExtendedInstruction((uint)(inst->inst_).opcode);
  if ((bVar4) && (bVar4 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type), bVar4)) {
    spvDbgInfoExtOperandCanBeForwardDeclaredFunction
              ((function<bool_(unsigned_int)> *)&local_228,(uint)(inst->inst_).opcode,
               (inst->inst_).ext_inst_type,
               (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[4]);
  }
  else {
    spvOperandCanBeForwardDeclaredFunction
              ((function<bool_(unsigned_int)> *)&local_228,(uint)(inst->inst_).opcode);
  }
  psVar7 = (inst->operands_).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((inst->operands_).
      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
      super__Vector_impl_data._M_finish == psVar7) {
    sVar6 = SPV_SUCCESS;
    if ((inst->inst_).opcode != 0x1151) goto LAB_001e3942;
  }
  else {
    uVar10 = 0;
    uVar13 = 1;
    local_23c = 0;
    local_230 = 0;
    local_238 = _;
    do {
      if (6 < psVar7[uVar10].type - SPV_OPERAND_TYPE_ID) goto switchD_001e3470_caseD_6;
      id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[psVar7[uVar10].offset];
      switch(psVar7[uVar10].type) {
      default:
        pIVar8 = ValidationState_t::FindDef(_,id);
        if (pIVar8 == (Instruction *)0x0) {
          local_208._0_4_ = uVar13 - 1;
          if (local_218 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          bVar4 = (*local_210)(&local_228,(uint *)&local_208);
          if (!bVar4) goto LAB_001e367a;
          iVar5 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
          if ((iVar5 == 0) || (bVar4 = ValidationState_t::IsForwardPointer(_,id), bVar4)) {
            sVar6 = ValidationState_t::ForwardDeclareId(_,id);
            uVar9 = CONCAT44(extraout_var,sVar6);
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8);
            ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," requires a previous definition",0x1f);
            sVar6 = local_208.error_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream(&local_208);
            uVar9 = extraout_RAX;
          }
          local_230 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
          goto LAB_001e379d;
        }
        uVar1 = (inst->inst_).opcode;
        op = (Op)uVar1;
        iVar5 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
        if (iVar5 == 0) {
LAB_001e34dd:
          if ((((((pIVar8->inst_).type_id == 0) && (iVar5 = spvOpcodeGeneratesType(op), iVar5 == 0))
               && (bVar4 = spvOpcodeIsDebug(op), !bVar4)) &&
              ((bVar4 = Instruction::IsDebugInfo(inst), !bVar4 &&
               (bVar4 = Instruction::IsNonSemantic(inst), !bVar4)))) &&
             ((bVar4 = spvOpcodeIsDecoration(op), !bVar4 && (bVar4 = spvOpcodeIsBranch(op), !bVar4))
             )) {
            if (uVar1 < 0xf5) {
              if ((OpFunction < op) || ((0x40000000001800U >> ((ulong)op & 0x3f) & 1) == 0))
              goto LAB_001e3849;
            }
            else if (op == OpSubgroupReadInvocationKHR || uVar1 < 0x1150) {
              if (2 < op - OpPhi) {
LAB_001e3849:
                bVar4 = spvOpcodeGeneratesUntypedPointer(op);
                pVVar3 = local_238;
                if ((op != OpUntypedArrayLengthKHR && !bVar4) &&
                   ((op != OpSpecConstantOp ||
                    ((uVar2 = (inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[3], uVar2 != 0x116c &&
                     (uVar2 != 0x14f2)))))) {
                  ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Operand ",8);
                  ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar3,id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_260._M_dataplus._M_p,
                             local_260._M_string_length);
                  pcVar12 = " requires a type";
                  lVar11 = 0x10;
                  goto LAB_001e39c8;
                }
              }
            }
            else if (((op != OpExtInstWithForwardRefsKHR) && (op != OpCooperativeMatrixLengthKHR))
                    && (op != OpCooperativeMatrixLengthNV)) goto LAB_001e3849;
          }
          bVar4 = Instruction::IsNonSemantic(pIVar8);
          _ = local_238;
          if ((!bVar4) ||
             (bVar4 = Instruction::IsNonSemantic(inst), pVVar3 = local_238, _ = local_238, bVar4))
          break;
          ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8);
          ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar3,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
          pcVar12 = " in semantic instruction cannot be a non-semantic instruction";
          lVar11 = 0x3d;
        }
        else {
          iVar5 = spvOpcodeGeneratesType(op);
          if ((((((iVar5 != 0) || (bVar4 = spvOpcodeIsDebug((uint)uVar1), bVar4)) ||
                (bVar4 = Instruction::IsDebugInfo(inst), bVar4)) ||
               ((bVar4 = Instruction::IsNonSemantic(inst), bVar4 ||
                (bVar4 = spvOpcodeIsDecoration(op), bVar4)))) || (op == OpFunction)) ||
             ((((op == OpCooperativeMatrixLengthKHR || (op == OpCooperativeMatrixLengthNV)) ||
               (bVar4 = spvOpcodeGeneratesUntypedPointer(op), pVVar3 = local_238,
               op == OpUntypedArrayLengthKHR || bVar4)) ||
              ((op == OpSpecConstantOp &&
               ((uVar2 = (inst->words_).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[3], uVar2 == 0x116c || (uVar2 == 0x14f2)))
               ))))) goto LAB_001e34dd;
          ValidationState_t::diag(&local_208,local_238,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Operand ",8);
          ValidationState_t::getIdName_abi_cxx11_(&local_260,pVVar3,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
          pcVar12 = " cannot be a type";
          lVar11 = 0x11;
        }
LAB_001e39c8:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar11);
        sVar6 = local_208.error_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001e393d;
      case SPV_OPERAND_TYPE_TYPE_ID:
        bVar4 = ValidationState_t::IsDefinedId(_,id);
        if (bVar4) {
          pIVar8 = ValidationState_t::FindDef(_,id);
          iVar5 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
          if (iVar5 != 0) break;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ID ",3);
          ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
          lVar11 = 0x11;
          pcVar12 = " is not a type id";
        }
        else {
LAB_001e367a:
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"ID ",3);
          ValidationState_t::getIdName_abi_cxx11_(&local_260,_,id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_260._M_dataplus._M_p,local_260._M_string_length);
          lVar11 = 0x15;
          pcVar12 = " has not been defined";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar11);
        sVar6 = local_208.error_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001e379d:
        if (sVar6 != SPV_SUCCESS) goto LAB_001e3942;
        break;
      case SPV_OPERAND_TYPE_RESULT_ID:
        local_23c = id;
        break;
      case SPV_OPERAND_TYPE_LITERAL_INTEGER:
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        if (((inst->inst_).opcode == 0x1151) && (bVar4 = Instruction::IsNonSemantic(inst), !bVar4))
        {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "OpExtInstWithForwardRefsKHR is only allowed with non-semantic instructions.";
          lVar11 = 0x4b;
          goto LAB_001e392b;
        }
      }
switchD_001e3470_caseD_6:
      uVar10 = (ulong)uVar13;
      psVar7 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = uVar13 + 1;
    } while (uVar10 < (ulong)((long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4))
    ;
    if ((inst->inst_).opcode != 0x1151 || (local_230 & 1) != 0) {
      sVar6 = SPV_SUCCESS;
      if (local_23c != 0) {
        ValidationState_t::RemoveIfForwardDeclared(_,local_23c);
      }
      goto LAB_001e3942;
    }
  }
  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
  pcVar12 = "Opcode OpExtInstWithForwardRefsKHR must have at least one forward declared ID.";
  lVar11 = 0x4e;
LAB_001e392b:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar11);
  sVar6 = local_208.error_;
LAB_001e393d:
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001e3942:
  if (local_218 != (code *)0x0) {
    (*local_218)(&local_228,&local_228,__destroy_functor);
  }
  return sVar6;
}

Assistant:

spv_result_t IdPass(ValidationState_t& _, Instruction* inst) {
  auto can_have_forward_declared_ids =
      spvIsExtendedInstruction(inst->opcode()) &&
              spvExtInstIsDebugInfo(inst->ext_inst_type())
          ? spvDbgInfoExtOperandCanBeForwardDeclaredFunction(
                inst->opcode(), inst->ext_inst_type(), inst->word(4))
          : spvOperandCanBeForwardDeclaredFunction(inst->opcode());

  // Keep track of a result id defined by this instruction.  0 means it
  // does not define an id.
  uint32_t result_id = 0;
  bool has_forward_declared_ids = false;

  for (unsigned i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    const spv_operand_type_t& type = operand.type;
    // We only care about Id operands, which are a single word.
    const uint32_t operand_word = inst->word(operand.offset);

    auto ret = SPV_ERROR_INTERNAL;
    switch (type) {
      case SPV_OPERAND_TYPE_RESULT_ID:
        // NOTE: Multiple Id definitions are being checked by the binary parser.
        //
        // Defer undefined-forward-reference removal until after we've analyzed
        // the remaining operands to this instruction.  Deferral only matters
        // for OpPhi since it's the only case where it defines its own forward
        // reference.  Other instructions that can have forward references
        // either don't define a value or the forward reference is to a function
        // Id (and hence defined outside of a function body).
        result_id = operand_word;
        // NOTE: The result Id is added (in RegisterInstruction) *after* all of
        // the other Ids have been checked to avoid premature use in the same
        // instruction.
        ret = SPV_SUCCESS;
        break;
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID:
        if (const auto def = _.FindDef(operand_word)) {
          const auto opcode = inst->opcode();
          if (spvOpcodeGeneratesType(def->opcode()) &&
              !spvOpcodeGeneratesType(opcode) && !spvOpcodeIsDebug(opcode) &&
              !inst->IsDebugInfo() && !inst->IsNonSemantic() &&
              !spvOpcodeIsDecoration(opcode) && opcode != spv::Op::OpFunction &&
              opcode != spv::Op::OpCooperativeMatrixLengthNV &&
              opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
              !spvOpcodeGeneratesUntypedPointer(opcode) &&
              opcode != spv::Op::OpUntypedArrayLengthKHR &&
              !(opcode == spv::Op::OpSpecConstantOp &&
                (spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthNV ||
                 spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " cannot be a type";
          } else if (def->type_id() == 0 && !spvOpcodeGeneratesType(opcode) &&
                     !spvOpcodeIsDebug(opcode) && !inst->IsDebugInfo() &&
                     !inst->IsNonSemantic() && !spvOpcodeIsDecoration(opcode) &&
                     !spvOpcodeIsBranch(opcode) && opcode != spv::Op::OpPhi &&
                     opcode != spv::Op::OpExtInst &&
                     opcode != spv::Op::OpExtInstWithForwardRefsKHR &&
                     opcode != spv::Op::OpExtInstImport &&
                     opcode != spv::Op::OpSelectionMerge &&
                     opcode != spv::Op::OpLoopMerge &&
                     opcode != spv::Op::OpFunction &&
                     opcode != spv::Op::OpCooperativeMatrixLengthNV &&
                     opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
                     !spvOpcodeGeneratesUntypedPointer(opcode) &&
                     opcode != spv::Op::OpUntypedArrayLengthKHR &&
                     !(opcode == spv::Op::OpSpecConstantOp &&
                       (spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthNV ||
                        spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " requires a type";
          } else if (def->IsNonSemantic() && !inst->IsNonSemantic()) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " in semantic instruction cannot be a non-semantic "
                      "instruction";
          } else {
            ret = SPV_SUCCESS;
          }
        } else if (can_have_forward_declared_ids(i)) {
          has_forward_declared_ids = true;
          if (spvOpcodeGeneratesType(inst->opcode()) &&
              !_.IsForwardPointer(operand_word)) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "Operand " << _.getIdName(operand_word)
                  << " requires a previous definition";
          } else {
            ret = _.ForwardDeclareId(operand_word);
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_TYPE_ID:
        if (_.IsDefinedId(operand_word)) {
          auto* def = _.FindDef(operand_word);
          if (!spvOpcodeGeneratesType(def->opcode())) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "ID " << _.getIdName(operand_word) << " is not a type id";
          } else {
            ret = SPV_SUCCESS;
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        // Ideally, this check would live in validate_extensions.cpp. But since
        // forward references are only allowed on non-semantic instructions, and
        // ID validation is done first, we would fail with a "ID had not been
        // defined" error before we could give a more helpful message. For this
        // reason, this test is done here, so we can be more helpful to the
        // user.
        if (inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR &&
            !inst->IsNonSemantic())
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "OpExtInstWithForwardRefsKHR is only allowed with "
                    "non-semantic instructions.";
        ret = SPV_SUCCESS;
        break;
      default:
        ret = SPV_SUCCESS;
        break;
    }
    if (SPV_SUCCESS != ret) return ret;
  }
  const bool must_have_forward_declared_ids =
      inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR;
  if (must_have_forward_declared_ids && !has_forward_declared_ids) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Opcode OpExtInstWithForwardRefsKHR must have at least one "
              "forward "
              "declared ID.";
  }

  if (result_id) _.RemoveIfForwardDeclared(result_id);

  return SPV_SUCCESS;
}